

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inlining.cpp
# Opt level: O3

vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> * __thiscall
wasm::anon_unknown_18::FunctionSplitter::getForwardedArgs
          (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *__return_storage_ptr__,
          FunctionSplitter *this,Function *func,Builder *builder)

{
  Expression *in_RAX;
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *pvVar1;
  Type TVar2;
  Index i;
  Index index;
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *pvVar3;
  Expression *local_38;
  
  (__return_storage_ptr__->
  super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pvVar3 = (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)0x0;
  local_38 = in_RAX;
  while( true ) {
    pvVar1 = (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
             Function::getNumParams((Function *)this);
    index = (Index)pvVar3;
    if (pvVar1 <= pvVar3) break;
    TVar2 = Function::getLocalType((Function *)this,index);
    local_38 = (Expression *)
               MixedArena::allocSpace
                         ((MixedArena *)
                          ((func->super_Importable).super_Named.name.super_IString.str._M_len +
                          0x200),0x18,8);
    local_38->_id = LocalGetId;
    *(Index *)(local_38 + 1) = index;
    (local_38->type).id = TVar2.id;
    std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
    emplace_back<wasm::Expression*>
              ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)__return_storage_ptr__
               ,&local_38);
    pvVar3 = (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)(ulong)(index + 1);
  }
  return pvVar1;
}

Assistant:

std::vector<Expression*> getForwardedArgs(Function* func, Builder& builder) {
    std::vector<Expression*> args;
    for (Index i = 0; i < func->getNumParams(); i++) {
      args.push_back(builder.makeLocalGet(i, func->getLocalType(i)));
    }
    return args;
  }